

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O3

bool __thiscall spvtools::opt::analysis::CompositeConstant::IsZero(CompositeConstant *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  
  iVar4 = (*(this->super_Constant)._vptr_Constant[0x18])();
  puVar1 = *(undefined8 **)CONCAT44(extraout_var,iVar4);
  puVar2 = (undefined8 *)((long *)CONCAT44(extraout_var,iVar4))[1];
  if (puVar1 == puVar2) {
    cVar3 = '\x01';
  }
  else {
    do {
      puVar5 = puVar1 + 1;
      cVar3 = (**(code **)(*(long *)*puVar1 + 0xb8))();
      if (cVar3 == '\0') {
        return false;
      }
      puVar1 = puVar5;
    } while (puVar5 != puVar2);
  }
  return (bool)cVar3;
}

Assistant:

bool IsZero() const override {
    for (const Constant* c : GetComponents()) {
      if (!c->IsZero()) {
        return false;
      }
    }
    return true;
  }